

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O0

Vec_Vec_t * Gia_ManLevelize(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Vec_t *p_00;
  bool bVar3;
  int local_2c;
  int i;
  int Level;
  int nLevels;
  Vec_Vec_t *vLevels;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManLevelNum(p);
  p_00 = Vec_VecStart(iVar1 + 1);
  local_2c = 0;
  while( true ) {
    bVar3 = false;
    if (local_2c < p->nObjs) {
      vLevels = (Vec_Vec_t *)Gia_ManObj(p,local_2c);
      bVar3 = vLevels != (Vec_Vec_t *)0x0;
    }
    if (!bVar3) break;
    iVar2 = Gia_ObjIsAnd((Gia_Obj_t *)vLevels);
    if (iVar2 != 0) {
      iVar2 = Gia_ObjLevel(p,(Gia_Obj_t *)vLevels);
      if (iVar1 < iVar2) {
        __assert_fail("Level <= nLevels",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDfs.c"
                      ,0x19d,"Vec_Vec_t *Gia_ManLevelize(Gia_Man_t *)");
      }
      Vec_VecPush(p_00,iVar2,vLevels);
    }
    local_2c = local_2c + 1;
  }
  return p_00;
}

Assistant:

Vec_Vec_t * Gia_ManLevelize( Gia_Man_t * p )
{ 
    Gia_Obj_t * pObj;
    Vec_Vec_t * vLevels;
    int nLevels, Level, i;
    nLevels = Gia_ManLevelNum( p );
    vLevels = Vec_VecStart( nLevels + 1 );
    Gia_ManForEachAnd( p, pObj, i )
    {
        Level = Gia_ObjLevel( p, pObj );
        assert( Level <= nLevels );
        Vec_VecPush( vLevels, Level, pObj );
    }
    return vLevels;
}